

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

ssize_t fio_flush(intptr_t uuid)

{
  FILE *__stream;
  ssize_t sVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  bool local_69;
  fio_str_info_s local_68;
  fio_str_info_s local_50;
  ulong local_38;
  size_t old_sent;
  fio_packet_s *old_packet;
  long lStack_20;
  int tmp;
  ssize_t flushed;
  intptr_t uuid_local;
  
  flushed = uuid;
  if (((uuid < 0) || (uVar2 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar2)) ||
     ((uuid & 0xffU) != (ulong)*(byte *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6d))) {
    piVar5 = __errno_location();
    *piVar5 = 9;
    return -1;
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  lStack_20 = 0;
  iVar3 = fio_trylock((fio_lock_i *)
                      ((long)fio_data + (long)(int)((ulong)flushed >> 8) * 0xa8 + 0x6e));
  if (iVar3 != 0) {
    piVar5 = __errno_location();
    *piVar5 = 0xb;
    return -1;
  }
  iVar3 = (int)((ulong)flushed >> 8);
  if (*(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0x40) == 0) {
    lStack_20 = (**(code **)(*(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0xa8) + 0x10))
                          (flushed,*(undefined8 *)((long)fio_data + (long)iVar3 * 0xa8 + 0xb0));
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)((ulong)flushed >> 8) * 0xa8 + 0x6e));
    if (lStack_20 == 0) {
      return 0;
    }
    if (-1 < lStack_20) {
      *(__time_t *)((long)fio_data + (long)(int)((ulong)flushed >> 8) * 0xa8 + 0x60) =
           (fio_data->last_cycle).tv_sec;
      return 1;
    }
  }
  else {
    old_sent = *(size_t *)((long)fio_data + (long)iVar3 * 0xa8 + 0x40);
    local_38 = *(ulong *)((long)fio_data + (long)iVar3 * 0xa8 + 0x50);
    old_packet._4_4_ =
         (**(code **)(*(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0x40) + 8))
                   ((ulong)flushed >> 8 & 0xffffffff);
    if (0 < old_packet._4_4_) {
      iVar3 = (int)((ulong)flushed >> 8);
      if (((0x3ff < *(ushort *)((long)fio_data + (long)iVar3 * 0xa8 + 0x68)) &&
          (*(size_t *)((long)fio_data + (long)iVar3 * 0xa8 + 0x40) == old_sent)) &&
         ((local_38 <= *(ulong *)((long)fio_data + (long)iVar3 * 0xa8 + 0x50) &&
          (*(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0x50) - local_38 < 0x8000)))) {
        if (2 < FIO_LOG_LEVEL) {
          fio_peer_addr(&local_50,flushed);
          fio_peer_addr(&local_68,flushed);
          FIO_LOG2STDERR("WARNING: (facil.io) possible Slowloris attack from %.*s",
                         local_50.len & 0xffffffff,local_68.data);
        }
        fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)((ulong)flushed >> 8) * 0xa8 + 0x6e));
        fio_clear_fd((long)(int)((ulong)flushed >> 8),'\0');
        return -1;
      }
      fio_unlock((fio_lock_i *)((long)fio_data + (long)iVar3 * 0xa8 + 0x6e));
      iVar3 = (int)((ulong)flushed >> 8);
      if ((*(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0x40) == 0) &&
         (*(char *)((long)fio_data + (long)iVar3 * 0xa8 + 0x70) != '\0')) {
        fio_force_close(flushed);
        return -1;
      }
      local_69 = false;
      if (*(char *)((long)fio_data + (long)iVar3 * 0xa8 + 0x6f) != '\0') {
        local_69 = *(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0x40) != 0;
      }
      return (long)(int)(uint)local_69;
    }
  }
  fio_unlock((fio_lock_i *)((long)fio_data + (long)flushed._1_4_ * 0xa8 + 0x6e));
  piVar5 = __errno_location();
  sVar1 = flushed;
  __stream = _stderr;
  iVar3 = *piVar5;
  if (iVar3 == 4) {
LAB_00140570:
    uuid_local = 1;
  }
  else {
    if ((iVar3 != 5) && (iVar3 != 9)) {
      if (iVar3 == 0xb) goto LAB_00140570;
      if (iVar3 == 0xe) {
        if (1 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "ERROR: fio_flush EFAULT - possible memory address error sent to Unix socket."
                        );
        }
      }
      else if (iVar3 != 0x16) {
        if (iVar3 != 0x1c) {
          if (iVar3 == 0x20) goto LAB_0014059e;
          if (((iVar3 != 99) && (iVar3 != 0x6b)) && (iVar3 != 0x73)) {
            puVar4 = (uint *)__errno_location();
            fprintf(__stream,"UUID error: %p (%d)\n",sVar1,(ulong)*puVar4);
            perror("No errno handler");
            return 0;
          }
        }
        goto LAB_00140570;
      }
    }
LAB_0014059e:
    *(undefined1 *)((long)fio_data + (long)(int)((ulong)flushed >> 8) * 0xa8 + 0x70) = 1;
    fio_force_close(flushed);
    uuid_local = -1;
  }
  return uuid_local;
}

Assistant:

ssize_t fio_flush(intptr_t uuid) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  errno = 0;
  ssize_t flushed = 0;
  int tmp;
  /* start critical section */
  if (fio_trylock(&uuid_data(uuid).sock_lock))
    goto would_block;

  if (!uuid_data(uuid).packet)
    goto flush_rw_hook;

  const fio_packet_s *old_packet = uuid_data(uuid).packet;
  const size_t old_sent = uuid_data(uuid).sent;

  tmp = uuid_data(uuid).packet->write_func(fio_uuid2fd(uuid),
                                           uuid_data(uuid).packet);
  if (tmp <= 0) {
    goto test_errno;
  }

  if (uuid_data(uuid).packet_count >= FIO_SLOWLORIS_LIMIT &&
      uuid_data(uuid).packet == old_packet &&
      uuid_data(uuid).sent >= old_sent &&
      (uuid_data(uuid).sent - old_sent) < 32768) {
    /* Slowloris attack assumed */
    goto attacked;
  }

  /* end critical section */
  fio_unlock(&uuid_data(uuid).sock_lock);

  /* test for fio_close marker */
  if (!uuid_data(uuid).packet && uuid_data(uuid).close)
    goto closed;

  /* return state */
  return uuid_data(uuid).open && uuid_data(uuid).packet != NULL;

would_block:
  errno = EWOULDBLOCK;
  return -1;

closed:
  fio_force_close(uuid);
  return -1;

flush_rw_hook:
  flushed = uuid_data(uuid).rw_hooks->flush(uuid, uuid_data(uuid).rw_udata);
  fio_unlock(&uuid_data(uuid).sock_lock);
  if (!flushed)
    return 0;
  if (flushed < 0) {
    goto test_errno;
  }
  touchfd(fio_uuid2fd(uuid));
  return 1;

test_errno:
  fio_unlock(&uuid_data(uuid).sock_lock);
  switch (errno) {
  case EWOULDBLOCK: /* fallthrough */
#if EWOULDBLOCK != EAGAIN
  case EAGAIN: /* fallthrough */
#endif
  case ENOTCONN:      /* fallthrough */
  case EINPROGRESS:   /* fallthrough */
  case ENOSPC:        /* fallthrough */
  case EADDRNOTAVAIL: /* fallthrough */
  case EINTR:
    return 1;
  case EFAULT:
    FIO_LOG_ERROR("fio_flush EFAULT - possible memory address error sent to "
                  "Unix socket.");
    /* fallthrough */
  case EPIPE:  /* fallthrough */
  case EIO:    /* fallthrough */
  case EINVAL: /* fallthrough */
  case EBADF:
    uuid_data(uuid).close = 1;
    fio_force_close(uuid);
    return -1;
  }
  fprintf(stderr, "UUID error: %p (%d)\n", (void *)uuid, errno);
  perror("No errno handler");
  return 0;

invalid:
  /* bad UUID */
  errno = EBADF;
  return -1;

attacked:
  /* don't close, just detach from facil.io and mark uuid as invalid */
  FIO_LOG_WARNING("(facil.io) possible Slowloris attack from %.*s",
                  (int)fio_peer_addr(uuid).len, fio_peer_addr(uuid).data);
  fio_unlock(&uuid_data(uuid).sock_lock);
  fio_clear_fd(fio_uuid2fd(uuid), 0);
  return -1;
}